

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O0

void __thiscall Fifteen::makeMove(Fifteen *this,Move move,size_t row,size_t col)

{
  BoardMode BVar1;
  pointer this_00;
  code *pcVar2;
  offset_in_Fifteen_to_subr moveTile;
  size_t col_local;
  size_t row_local;
  Move move_local;
  Fifteen *this_local;
  
  this_00 = std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->
                      (&this->controller);
  BVar1 = Controller::getBoardMode(this_00);
  pcVar2 = moveGraphicTile;
  if (BVar1 == NUMERIC) {
    pcVar2 = moveNumericTile;
  }
  switch(move) {
  case UP:
    (*pcVar2)(this,row,col,row - 1,col);
    break;
  case RIGHT:
    (*pcVar2)(this,row,col,row,col + 1);
    break;
  case DOWN:
    (*pcVar2)(this,row,col,row + 1,col);
    break;
  case LEFT:
    (*pcVar2)(this,row,col,row,col - 1);
  }
  return;
}

Assistant:

void Fifteen::makeMove( Move move, size_t row, size_t col )
{
    auto moveTile = ( controller->getBoardMode() == BoardMode::NUMERIC ) ? &Fifteen::moveNumericTile :
                                                                           &Fifteen::moveGraphicTile;
    switch ( move )
    {
        case Move::UP:
            ( this->*moveTile )( row, col, row - 1, col );
            return;
        case Move::RIGHT:
            ( this->*moveTile )( row, col, row, col + 1 );
            return;
        case Move::DOWN:
            ( this->*moveTile )( row, col, row + 1, col );
            return;
        case Move::LEFT:
            ( this->*moveTile )( row, col, row, col - 1 );
            return;
    }
}